

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_hosts_file.c
# Opt level: O0

ares_hosts_file_match_t
ares_hosts_file_match(ares_hosts_file_t *hf,ares_hosts_entry_t *entry,ares_hosts_entry_t **match)

{
  char *pcVar1;
  ares_hosts_entry_t *paVar2;
  char *host;
  char *ipaddr;
  ares_llist_node_t *node;
  ares_hosts_entry_t **match_local;
  ares_hosts_entry_t *entry_local;
  ares_hosts_file_t *hf_local;
  
  *match = (ares_hosts_entry_t *)0x0;
  for (ipaddr = (char *)ares_llist_node_first(entry->ips); ipaddr != (char *)0x0;
      ipaddr = (char *)ares_llist_node_next((ares_llist_node_t *)ipaddr)) {
    pcVar1 = (char *)ares_llist_node_val((ares_llist_node_t *)ipaddr);
    paVar2 = (ares_hosts_entry_t *)ares_htable_strvp_get_direct(hf->iphash,pcVar1);
    *match = paVar2;
    if (*match != (ares_hosts_entry_t *)0x0) {
      return ARES_MATCH_IPADDR;
    }
  }
  ipaddr = (char *)ares_llist_node_first(entry->hosts);
  while( true ) {
    if (ipaddr == (char *)0x0) {
      return ARES_MATCH_NONE;
    }
    pcVar1 = (char *)ares_llist_node_val((ares_llist_node_t *)ipaddr);
    paVar2 = (ares_hosts_entry_t *)ares_htable_strvp_get_direct(hf->hosthash,pcVar1);
    *match = paVar2;
    if (*match != (ares_hosts_entry_t *)0x0) break;
    ipaddr = (char *)ares_llist_node_next((ares_llist_node_t *)ipaddr);
  }
  return ARES_MATCH_HOST;
}

Assistant:

static ares_hosts_file_match_t
  ares_hosts_file_match(const ares_hosts_file_t *hf, ares_hosts_entry_t *entry,
                        ares_hosts_entry_t **match)
{
  ares_llist_node_t *node;
  *match = NULL;

  for (node = ares_llist_node_first(entry->ips); node != NULL;
       node = ares_llist_node_next(node)) {
    const char *ipaddr = ares_llist_node_val(node);
    *match             = ares_htable_strvp_get_direct(hf->iphash, ipaddr);
    if (*match != NULL) {
      return ARES_MATCH_IPADDR;
    }
  }

  for (node = ares_llist_node_first(entry->hosts); node != NULL;
       node = ares_llist_node_next(node)) {
    const char *host = ares_llist_node_val(node);
    *match           = ares_htable_strvp_get_direct(hf->hosthash, host);
    if (*match != NULL) {
      return ARES_MATCH_HOST;
    }
  }

  return ARES_MATCH_NONE;
}